

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSim.c
# Opt level: O0

int Saig_ManSimDataInit2(Aig_Man_t *p,Abc_Cex_t *pCex,Vec_Ptr_t *vSimInfo)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pObj_00;
  int local_44;
  int local_40;
  int iBit;
  int f;
  int i;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vSimInfo_local;
  Abc_Cex_t *pCex_local;
  Aig_Man_t *p_local;
  
  local_44 = 0;
  for (iBit = 0; iVar1 = Saig_ManRegNum(p), iBit < iVar1; iBit = iBit + 1) {
    p_00 = p->vCis;
    iVar1 = Saig_ManPiNum(p);
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p_00,iBit + iVar1);
    iVar1 = Abc_InfoHasBit((uint *)(pCex + 1),local_44);
    Saig_ManSimInfo2Set(vSimInfo,pAVar2,0,(uint)(iVar1 != 0));
    local_44 = local_44 + 1;
  }
  for (local_40 = 0; local_40 <= pCex->iFrame; local_40 = local_40 + 1) {
    pAVar2 = Aig_ManConst1(p);
    Saig_ManSimInfo2Set(vSimInfo,pAVar2,local_40,1);
    for (iBit = 0; iVar1 = Saig_ManPiNum(p), iBit < iVar1; iBit = iBit + 1) {
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,iBit);
      iVar1 = Abc_InfoHasBit((uint *)(pCex + 1),local_44);
      Saig_ManSimInfo2Set(vSimInfo,pAVar2,local_40,(uint)(iVar1 != 0));
      local_44 = local_44 + 1;
    }
    for (iBit = 0; iVar1 = Vec_PtrSize(p->vObjs), iBit < iVar1; iBit = iBit + 1) {
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iBit);
      if ((pAVar2 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar2), iVar1 != 0)) {
        Saig_ManExtendOneEval2(vSimInfo,pAVar2,local_40);
      }
    }
    for (iBit = 0; iVar1 = Vec_PtrSize(p->vCos), iBit < iVar1; iBit = iBit + 1) {
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,iBit);
      Saig_ManExtendOneEval2(vSimInfo,pAVar2,local_40);
    }
    if (local_40 == pCex->iFrame) break;
    for (iBit = 0; iVar1 = Saig_ManRegNum(p), iBit < iVar1; iBit = iBit + 1) {
      pAVar2 = Saig_ManLi(p,iBit);
      pObj_00 = Saig_ManLo(p,iBit);
      iVar1 = Saig_ManSimInfo2Get(vSimInfo,pAVar2,local_40);
      Saig_ManSimInfo2Set(vSimInfo,pObj_00,local_40 + 1,iVar1);
    }
  }
  pAVar2 = Aig_ManCo(p,pCex->iPo);
  iVar1 = Saig_ManSimInfo2Get(vSimInfo,pAVar2,pCex->iFrame);
  return iVar1;
}

Assistant:

int Saig_ManSimDataInit2( Aig_Man_t * p, Abc_Cex_t * pCex, Vec_Ptr_t * vSimInfo )
{
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i, f, iBit = 0;
    Saig_ManForEachLo( p, pObj, i )
        Saig_ManSimInfo2Set( vSimInfo, pObj, 0, Abc_InfoHasBit(pCex->pData, iBit++)?SAIG_ONE_NEW:SAIG_ZER_NEW );
    for ( f = 0; f <= pCex->iFrame; f++ )
    {
        Saig_ManSimInfo2Set( vSimInfo, Aig_ManConst1(p), f, SAIG_ONE_NEW );
        Saig_ManForEachPi( p, pObj, i )
            Saig_ManSimInfo2Set( vSimInfo, pObj, f, Abc_InfoHasBit(pCex->pData, iBit++)?SAIG_ONE_NEW:SAIG_ZER_NEW );
        Aig_ManForEachNode( p, pObj, i )
            Saig_ManExtendOneEval2( vSimInfo, pObj, f );
        Aig_ManForEachCo( p, pObj, i )
            Saig_ManExtendOneEval2( vSimInfo, pObj, f );
        if ( f == pCex->iFrame )
            break;
        Saig_ManForEachLiLo( p, pObjLi, pObjLo, i )
            Saig_ManSimInfo2Set( vSimInfo, pObjLo, f+1, Saig_ManSimInfo2Get(vSimInfo, pObjLi, f) );
    }
    // make sure the output of the property failed
    pObj = Aig_ManCo( p, pCex->iPo );
    return Saig_ManSimInfo2Get( vSimInfo, pObj, pCex->iFrame );
}